

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_LibraryDelete(Mio_Library_t *pLib)

{
  Abc_Frame_t *p;
  Mio_Gate_t *local_30;
  Mio_Gate_t *local_28;
  Mio_Gate_t *local_20;
  Mio_Gate_t *pGate2;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib_local;
  
  if (pLib != (Mio_Library_t *)0x0) {
    p = Abc_FrameGetGlobalFrame();
    Abc_FrameUnmapAllNetworks(p);
    if (pLib->pName != (char *)0x0) {
      free(pLib->pName);
      pLib->pName = (char *)0x0;
    }
    pGate2 = Mio_LibraryReadGates(pLib);
    if (pGate2 == (Mio_Gate_t *)0x0) {
      local_28 = (Mio_Gate_t *)0x0;
    }
    else {
      local_28 = Mio_GateReadNext(pGate2);
    }
    local_20 = local_28;
    while (pGate2 != (Mio_Gate_t *)0x0) {
      Mio_GateDelete(pGate2);
      pGate2 = local_20;
      if (local_20 == (Mio_Gate_t *)0x0) {
        local_30 = (Mio_Gate_t *)0x0;
      }
      else {
        local_30 = Mio_GateReadNext(local_20);
      }
      local_20 = local_30;
    }
    Mem_FlexStop(pLib->pMmFlex,0);
    Vec_StrFree(pLib->vCube);
    if (pLib->tName2Gate != (st__table *)0x0) {
      st__free_table(pLib->tName2Gate);
    }
    if (pLib->ppGates0 != (Mio_Gate_t **)0x0) {
      free(pLib->ppGates0);
      pLib->ppGates0 = (Mio_Gate_t **)0x0;
    }
    if (pLib->ppGatesName != (Mio_Gate_t **)0x0) {
      free(pLib->ppGatesName);
      pLib->ppGatesName = (Mio_Gate_t **)0x0;
    }
    if (pLib != (Mio_Library_t *)0x0) {
      free(pLib);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Mio_LibraryDelete( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate, * pGate2;
    if ( pLib == NULL )
        return;
    // free the bindings of nodes to gates from this library for all networks
    Abc_FrameUnmapAllNetworks( Abc_FrameGetGlobalFrame() );
    // free the library
    ABC_FREE( pLib->pName );
    Mio_LibraryForEachGateSafe( pLib, pGate, pGate2 )
        Mio_GateDelete( pGate );
    Mem_FlexStop( pLib->pMmFlex, 0 );
    Vec_StrFree( pLib->vCube );
    if ( pLib->tName2Gate )
        st__free_table( pLib->tName2Gate );
//    if ( pLib->dd )
//        Cudd_Quit( pLib->dd );
    ABC_FREE( pLib->ppGates0 );
    ABC_FREE( pLib->ppGatesName );
    ABC_FREE( pLib );
}